

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::SmallVectorBase<slang::SourceBuffer>::emplaceRealloc<slang::SourceBuffer_const&>
          (SmallVectorBase<slang::SourceBuffer> *this,pointer pos,SourceBuffer *args)

{
  undefined8 *puVar1;
  ulong uVar2;
  size_t *psVar3;
  size_t sVar4;
  char *pcVar5;
  undefined8 uVar6;
  size_t sVar7;
  BufferID BVar8;
  undefined4 uVar9;
  SourceBuffer *__cur_1;
  pointer pSVar10;
  pointer pSVar11;
  pointer pSVar12;
  pointer pSVar13;
  EVP_PKEY_CTX *pEVar14;
  EVP_PKEY_CTX *ctx;
  long lVar15;
  
  if (this->len == 0x3ffffffffffffff) {
    detail::throwLengthError();
  }
  pEVar14 = (EVP_PKEY_CTX *)(this->len + 1);
  uVar2 = this->cap;
  ctx = (EVP_PKEY_CTX *)(uVar2 * 2);
  if (pEVar14 < ctx) {
    pEVar14 = ctx;
  }
  if (0x3ffffffffffffff - uVar2 < uVar2) {
    pEVar14 = (EVP_PKEY_CTX *)0x3ffffffffffffff;
  }
  lVar15 = (long)pos - (long)this->data_;
  pSVar10 = (pointer)operator_new((long)pEVar14 << 5);
  sVar4 = (args->data)._M_len;
  pcVar5 = (args->data)._M_str;
  uVar6 = *(undefined8 *)&args->id;
  puVar1 = (undefined8 *)((long)pSVar10 + lVar15 + 0x10);
  *puVar1 = args->library;
  puVar1[1] = uVar6;
  *(size_t *)((long)pSVar10 + lVar15) = sVar4;
  ((size_t *)((long)pSVar10 + lVar15))[1] = (size_t)pcVar5;
  pSVar13 = this->data_;
  pSVar11 = pSVar13 + this->len;
  pSVar12 = pSVar10;
  if (pSVar11 == pos) {
    for (; pSVar13 != pos; pSVar13 = pSVar13 + 1) {
      sVar4 = (pSVar13->data)._M_len;
      pcVar5 = (pSVar13->data)._M_str;
      BVar8.id = (pSVar13->id).id;
      uVar9 = *(undefined4 *)&pSVar13->field_0x1c;
      pSVar12->library = pSVar13->library;
      pSVar12->id = (BufferID)BVar8.id;
      *(undefined4 *)&pSVar12->field_0x1c = uVar9;
      (pSVar12->data)._M_len = sVar4;
      (pSVar12->data)._M_str = pcVar5;
      pSVar12 = pSVar12 + 1;
    }
  }
  else {
    for (; pSVar13 != pos; pSVar13 = pSVar13 + 1) {
      sVar4 = (pSVar13->data)._M_len;
      pcVar5 = (pSVar13->data)._M_str;
      BVar8.id = (pSVar13->id).id;
      uVar9 = *(undefined4 *)&pSVar13->field_0x1c;
      pSVar12->library = pSVar13->library;
      pSVar12->id = (BufferID)BVar8.id;
      *(undefined4 *)&pSVar12->field_0x1c = uVar9;
      (pSVar12->data)._M_len = sVar4;
      (pSVar12->data)._M_str = pcVar5;
      pSVar12 = pSVar12 + 1;
    }
    psVar3 = (size_t *)(lVar15 + (long)pSVar10);
    for (; pos != pSVar11; pos = pos + 1) {
      sVar4 = (pos->data)._M_len;
      pcVar5 = (pos->data)._M_str;
      sVar7 = *(size_t *)&pos->id;
      psVar3[6] = (size_t)pos->library;
      psVar3[7] = sVar7;
      psVar3[4] = sVar4;
      psVar3[5] = (size_t)pcVar5;
      psVar3 = psVar3 + 4;
    }
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = (size_type)pEVar14;
  this->data_ = pSVar10;
  return (pointer)((long)pSVar10 + lVar15);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}